

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cpp
# Opt level: O3

void CreateBackwardReferencesDH65
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  int *piVar1;
  ulong uVar2;
  long lVar3;
  void *pvVar4;
  void *pvVar5;
  ushort uVar6;
  uint32_t uVar7;
  undefined4 uVar8;
  size_t sVar9;
  size_t sVar10;
  uint32_t *puVar11;
  uint32_t *puVar12;
  BrotliEncoderDictionary *pBVar13;
  void *pvVar14;
  uint64_t uVar15;
  HasherCommon *pHVar16;
  size_t sVar17;
  size_t sVar18;
  PreparedDictionary *pPVar19;
  BrotliDictionary *pBVar20;
  void *pvVar21;
  size_t sVar22;
  undefined8 uVar23;
  byte bVar24;
  bool bVar25;
  ulong uVar26;
  uint32_t uVar27;
  uint uVar28;
  uint uVar29;
  int iVar30;
  long lVar31;
  void *pvVar32;
  void *pvVar33;
  byte bVar34;
  void *pvVar35;
  long lVar36;
  ulong uVar37;
  uint8_t *puVar38;
  long lVar39;
  ulong *puVar40;
  void *pvVar41;
  ulong uVar42;
  ulong uVar43;
  undefined8 *puVar44;
  void *pvVar45;
  uint32_t *buckets_1;
  void *pvVar46;
  ulong uVar47;
  uint16_t uVar48;
  uint *puVar49;
  byte bVar50;
  uint uVar51;
  void *pvVar52;
  ulong *puVar53;
  long lVar54;
  uint8_t *puVar55;
  ulong *puVar56;
  ulong uVar57;
  int last_distance;
  int iVar58;
  long lVar59;
  ulong uVar60;
  uint8_t *puVar61;
  ulong *puVar62;
  uint uVar63;
  uint8_t *s1_orig_2;
  int *piVar64;
  size_t sVar65;
  ulong uVar66;
  ulong *puVar67;
  uint32_t *buckets;
  ulong uVar68;
  uint8_t *puVar69;
  ulong uVar70;
  long lVar71;
  ulong uVar72;
  bool bVar73;
  ulong uVar74;
  ulong uVar75;
  void *local_1c0;
  ulong local_1b8;
  ulong local_1a8;
  void *local_1a0;
  ulong local_198;
  ulong local_190;
  size_t local_188;
  int local_15c;
  ulong local_130;
  void *local_120;
  ulong local_118;
  Command *local_110;
  ulong local_100;
  uint local_e0;
  int local_dc;
  void *local_c8;
  ulong local_88;
  uint8_t *s1_orig_5;
  
  iVar30 = params->lgwin;
  pvVar4 = (void *)((position - 7) + num_bytes);
  pvVar35 = (void *)position;
  if (7 < num_bytes) {
    pvVar35 = pvVar4;
  }
  sVar9 = params->stream_offset;
  lVar36 = 0x200;
  if (params->quality < 9) {
    lVar36 = 0x40;
  }
  local_188 = *last_insert_len;
  uVar2 = position + num_bytes;
  sVar10 = (params->dictionary).compound.total_size;
  uVar29 = (uint)(hasher->privat)._H35.hb.next_ix;
  if (4 < (int)uVar29) {
    iVar58 = *dist_cache;
    dist_cache[4] = iVar58 + -1;
    dist_cache[5] = iVar58 + 1;
    dist_cache[6] = iVar58 + -2;
    dist_cache[7] = iVar58 + 2;
    *(ulong *)(dist_cache + 8) = CONCAT44(iVar58 + 3,iVar58 + -3);
    if (10 < uVar29) {
      iVar58 = dist_cache[1];
      dist_cache[10] = iVar58 + -1;
      dist_cache[0xb] = iVar58 + 1;
      dist_cache[0xc] = iVar58 + -2;
      dist_cache[0xd] = iVar58 + 2;
      *(ulong *)(dist_cache + 0xe) = CONCAT44(iVar58 + 3,iVar58 + -3);
    }
  }
  if (uVar2 <= position + 8) {
    local_110 = commands;
LAB_0110c1a0:
    *last_insert_len = (local_188 + uVar2) - position;
    *num_commands = *num_commands + ((long)local_110 - (long)commands >> 4);
    return;
  }
  pvVar5 = (void *)((1L << ((byte)iVar30 & 0x3f)) - 0x10);
  pvVar46 = (void *)(lVar36 + position);
  puVar11 = (hasher->privat)._H5.buckets_;
  puVar12 = (hasher->privat)._H6.buckets_;
  lVar31 = sVar10 + 1;
  lVar3 = position - 1;
  local_110 = commands;
  pvVar45 = (void *)position;
LAB_0110a16e:
  pvVar52 = pvVar5;
  if (pvVar45 < pvVar5) {
    pvVar52 = pvVar45;
  }
  pvVar41 = (void *)(sVar9 + (long)pvVar45);
  if (pvVar5 <= (void *)(sVar9 + (long)pvVar45)) {
    pvVar41 = pvVar5;
  }
  if ((params->dictionary).contextual.context_based == 0) {
    local_e0 = 0;
    local_88 = 0;
  }
  else {
    if (pvVar45 == (void *)0x0) {
      local_88 = 0;
LAB_0110a1d2:
      uVar68 = 0;
    }
    else {
      local_88 = (ulong)ringbuffer[(long)pvVar45 - 1U & ringbuffer_mask];
      if (pvVar45 == (void *)0x1) goto LAB_0110a1d2;
      uVar68 = (ulong)ringbuffer[(long)pvVar45 - 2U & ringbuffer_mask];
    }
    local_e0 = (uint)(params->dictionary).contextual.context_map
                     [literal_context_lut[uVar68 + 0x100] | literal_context_lut[local_88]];
  }
  uVar68 = uVar2 - (long)pvVar45;
  pBVar13 = (params->dictionary).contextual.dict[local_e0];
  pvVar14 = (void *)(params->dist).max_distance;
  uVar74 = (ulong)pvVar45 & ringbuffer_mask;
  uVar42 = (ulong)(hasher->privat)._H6.num_last_distances_to_check_;
  if (uVar42 != 0) {
    puVar61 = ringbuffer + uVar74;
    local_1a8 = 0x7e4;
    uVar75 = 0;
    uVar57 = 0;
    local_1a0 = (void *)0x0;
    local_120 = (void *)0x0;
LAB_0110a270:
    pvVar32 = (void *)(long)dist_cache[uVar57];
    if (((pvVar32 <= pvVar52) && ((void *)((long)pvVar45 - (long)pvVar32) < pvVar45)) &&
       (uVar75 + uVar74 <= ringbuffer_mask)) {
      uVar37 = (ulong)((long)pvVar45 - (long)pvVar32) & ringbuffer_mask;
      uVar60 = uVar37 + uVar75;
      if ((ringbuffer_mask < uVar60) || (ringbuffer[uVar75 + uVar74] != ringbuffer[uVar60]))
      goto LAB_0110a3c3;
      puVar38 = ringbuffer + uVar37;
      puVar55 = puVar38;
      uVar60 = uVar68;
      puVar69 = puVar61;
      if (7 < uVar68) {
        lVar54 = 0;
        lVar59 = 0;
LAB_0110a2df:
        if (*(ulong *)(puVar61 + lVar54) == *(ulong *)(puVar38 + lVar54)) goto code_r0x0110a2ec;
        uVar37 = *(ulong *)(puVar38 + lVar54) ^ *(ulong *)(puVar61 + lVar54);
        uVar60 = 0;
        if (uVar37 != 0) {
          for (; (uVar37 >> uVar60 & 1) == 0; uVar60 = uVar60 + 1) {
          }
        }
        uVar60 = (uVar60 >> 3 & 0x1fffffff) - lVar59;
        goto LAB_0110a366;
      }
      goto LAB_0110a316;
    }
    goto LAB_0110a3c3;
  }
  local_1a8 = 0x7e4;
  local_120 = (void *)0x0;
  local_1a0 = (void *)0x0;
  uVar75 = 0;
LAB_0110a3e9:
  puVar53 = (ulong *)(ringbuffer + uVar74);
  uVar42 = (hasher->privat)._H5.block_size_;
  uVar15 = (hasher->privat)._H6.hash_mul_;
  uVar37 = *(long *)(ringbuffer + uVar74) * uVar15 >> 0x31;
  lVar54 = uVar37 << (*(byte *)((long)&hasher->privat + 0x1c) & 0x3f);
  uVar6 = *(ushort *)((long)puVar11 + uVar37 * 2);
  uVar60 = (ulong)uVar6;
  uVar57 = 0;
  if (uVar42 <= uVar60) {
    uVar57 = uVar60 - uVar42;
  }
  uVar29 = (hasher->privat)._H6.block_mask_;
  uVar63 = (uint)ringbuffer_mask;
  if (uVar57 < uVar60) {
    uVar66 = uVar68 - 4;
    piVar1 = (int *)((long)puVar53 + 4);
LAB_0110a483:
    uVar60 = uVar60 - 1;
    pvVar32 = (void *)((long)pvVar45 - (ulong)puVar12[lVar54 + (ulong)((uint)uVar60 & uVar29)]);
    if (pvVar32 <= pvVar52) {
      if (uVar75 + uVar74 <= ringbuffer_mask) {
        uVar70 = (ulong)(puVar12[lVar54 + (ulong)((uint)uVar60 & uVar29)] & uVar63);
        if (((ringbuffer_mask < uVar70 + uVar75) ||
            (ringbuffer[uVar75 + uVar74] != ringbuffer[uVar70 + uVar75])) ||
           (*(int *)(ringbuffer + uVar70) != (int)*(long *)(ringbuffer + uVar74)))
        goto LAB_0110a555;
        puVar55 = ringbuffer + uVar70 + 4;
        piVar64 = piVar1;
        puVar61 = puVar55;
        uVar70 = uVar66;
        if (7 < uVar66) {
          lVar59 = 0;
LAB_0110a4fd:
          if (*(ulong *)((long)piVar1 + lVar59) == *(ulong *)(puVar55 + lVar59))
          goto code_r0x0110a50f;
          uVar43 = *(ulong *)(puVar55 + lVar59) ^ *(ulong *)((long)piVar1 + lVar59);
          uVar70 = 0;
          if (uVar43 != 0) {
            for (; (uVar43 >> uVar70 & 1) == 0; uVar70 = uVar70 + 1) {
            }
          }
          lVar59 = (uVar70 >> 3 & 0x1fffffff) + lVar59;
          goto LAB_0110a580;
        }
        goto LAB_0110a526;
      }
      goto LAB_0110a555;
    }
  }
LAB_0110a5b8:
  puVar12[lVar54 + (ulong)(uVar29 & uVar6)] = (uint32_t)pvVar45;
  *(ushort *)((long)puVar11 + uVar37 * 2) = uVar6 + 1;
  local_15c = 0;
  if (local_1a8 == 0x7e4) {
    pHVar16 = (hasher->privat)._H6.common_;
    uVar75 = pHVar16->dict_num_lookups;
    local_198 = pHVar16->dict_num_matches;
    local_1a8 = 0x7e4;
    if (uVar75 >> 7 <= local_198) {
      uVar57 = (ulong)((uint)((int)*puVar53 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
      puVar61 = pBVar13->hash_table_lengths;
      local_1a8 = 0x7e4;
      local_15c = 0;
      bVar73 = true;
LAB_0110a6d5:
      uVar75 = uVar75 + 1;
      pHVar16->dict_num_lookups = uVar75;
      bVar34 = puVar61[uVar57];
      uVar60 = (ulong)bVar34;
      if ((uVar60 != 0) && (uVar60 <= uVar68)) {
        pBVar20 = pBVar13->words;
        puVar40 = (ulong *)(pBVar20->data +
                           (ulong)pBVar20->offsets_by_length[uVar60] +
                           pBVar13->hash_table_words[uVar57] * uVar60);
        uVar37 = uVar60;
        puVar67 = puVar53;
        if (7 < bVar34) {
          lVar54 = 0;
          puVar62 = puVar53;
LAB_0110a732:
          if (*puVar40 == *puVar62) goto code_r0x0110a73d;
          uVar66 = *puVar62 ^ *puVar40;
          uVar37 = 0;
          if (uVar66 != 0) {
            for (; (uVar66 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
            }
          }
          uVar37 = (uVar37 >> 3 & 0x1fffffff) - lVar54;
          goto LAB_0110a7a2;
        }
        goto LAB_0110a76c;
      }
      goto LAB_0110a824;
    }
  }
LAB_0110a61b:
  local_100 = (ulong)local_1a0;
  if (0x1f < uVar68) {
    pvVar32 = (hasher->privat)._H35.ha_common.extra[3];
    if (pvVar32 <= pvVar45) {
      uVar29 = (hasher->privat)._H65.hb.state;
      uVar27 = (hasher->privat)._H65.hb.factor;
      uVar7 = (hasher->privat)._H65.hb.factor_remove;
LAB_0110a8bb:
      uVar51 = uVar29 & 0x3fffffff;
      bVar34 = ringbuffer[(ulong)pvVar32 & ringbuffer_mask];
      bVar50 = ringbuffer[(long)pvVar32 + 0x20U & ringbuffer_mask];
      if (uVar51 < 0x1000000) {
        pvVar33 = (hasher->privat)._H35.ha_common.extra[2];
        uVar28 = *(uint *)((long)pvVar33 + (ulong)uVar51 * 4);
        *(int *)((long)pvVar33 + (ulong)uVar51 * 4) = (int)pvVar32;
        if ((pvVar32 == pvVar45) && (uVar28 != 0xffffffff)) {
          uVar51 = (uint32_t)pvVar45 - uVar28;
          if ((void *)(ulong)uVar51 <= pvVar52) {
            puVar61 = ringbuffer + (uVar28 & uVar63);
            lVar59 = 0;
            lVar54 = 0;
LAB_0110a975:
            lVar39 = lVar54;
            if (*(ulong *)((long)puVar53 + lVar59) == *(ulong *)(puVar61 + lVar59))
            goto code_r0x0110a986;
            uVar57 = *(ulong *)(puVar61 + lVar59) ^ *(ulong *)((long)puVar53 + lVar59);
            uVar75 = 0;
            if (uVar57 != 0) {
              for (; (uVar57 >> uVar75 & 1) == 0; uVar75 = uVar75 + 1) {
              }
            }
            uVar75 = lVar59 + (uVar75 >> 3 & 0x1fffffff);
            goto LAB_0110a9f7;
          }
        }
      }
      goto LAB_0110a934;
    }
    goto LAB_0110aa67;
  }
  goto LAB_0110aa72;
code_r0x0110a2ec:
  lVar54 = lVar54 + 8;
  lVar39 = lVar59 + uVar68;
  lVar59 = lVar59 + -8;
  if (lVar39 - 8U < 8) goto code_r0x0110a302;
  goto LAB_0110a2df;
code_r0x0110a302:
  puVar55 = puVar38 + -lVar59;
  puVar69 = puVar61 + -lVar59;
  uVar60 = lVar59 + uVar68;
LAB_0110a316:
  if (uVar60 != 0) {
    uVar37 = 0;
    do {
      uVar66 = uVar37;
      if (puVar55[uVar37] != puVar69[uVar37]) break;
      uVar37 = uVar37 + 1;
      uVar66 = uVar60;
    } while (uVar60 != uVar37);
    puVar55 = puVar55 + uVar66;
  }
  uVar60 = (long)puVar55 - (long)puVar38;
LAB_0110a366:
  if (((2 < uVar60) || ((uVar57 < 2 && (uVar60 == 2)))) &&
     (uVar37 = uVar60 * 0x87 + 0x78f, local_1a8 < uVar37)) {
    if (uVar57 != 0) {
      uVar37 = uVar37 - ((0x1ca10U >> ((byte)uVar57 & 0xe) & 0xe) + 0x27);
    }
    if (local_1a8 < uVar37) {
      local_120 = pvVar32;
      uVar75 = uVar60;
      local_1a8 = uVar37;
      local_1a0 = (void *)uVar60;
    }
  }
LAB_0110a3c3:
  uVar57 = uVar57 + 1;
  if (uVar57 == uVar42) goto LAB_0110a3e9;
  goto LAB_0110a270;
code_r0x0110a50f:
  uVar70 = uVar70 - 8;
  lVar59 = lVar59 + 8;
  if (uVar70 < 8) goto code_r0x0110a51d;
  goto LAB_0110a4fd;
code_r0x0110a51d:
  puVar61 = puVar55 + lVar59;
  piVar64 = (int *)(lVar59 + (long)piVar1);
LAB_0110a526:
  puVar69 = puVar61;
  if (uVar70 != 0) {
    puVar69 = puVar61 + uVar70;
    uVar43 = 0;
    do {
      if (puVar61[uVar43] != *(uint8_t *)((long)piVar64 + uVar43)) {
        puVar69 = puVar61 + uVar43;
        break;
      }
      uVar43 = uVar43 + 1;
    } while (uVar70 != uVar43);
  }
  lVar59 = (long)puVar69 - (long)puVar55;
LAB_0110a580:
  uVar70 = lVar59 + 4;
  iVar30 = 0x1f;
  if ((uint)pvVar32 != 0) {
    for (; (uint)pvVar32 >> iVar30 == 0; iVar30 = iVar30 + -1) {
    }
  }
  uVar43 = (ulong)(iVar30 * -0x1e + 0x780) + uVar70 * 0x87;
  if (local_1a8 < uVar43) {
    local_120 = pvVar32;
    uVar75 = uVar70;
    local_1a8 = uVar43;
    local_1a0 = (void *)uVar70;
  }
LAB_0110a555:
  if (uVar60 <= uVar57) goto LAB_0110a5b8;
  goto LAB_0110a483;
code_r0x0110a73d:
  puVar40 = puVar40 + 1;
  puVar62 = puVar62 + 1;
  lVar59 = uVar60 + lVar54;
  lVar54 = lVar54 + -8;
  if (lVar59 - 8U < 8) goto code_r0x0110a757;
  goto LAB_0110a732;
code_r0x0110a757:
  uVar37 = lVar54 + uVar60;
  puVar67 = puVar62;
  if (lVar54 + uVar60 != 0) {
LAB_0110a76c:
    puVar62 = (ulong *)((long)puVar67 + uVar37);
    uVar66 = 0;
    do {
      if (*(char *)((long)puVar67 + uVar66) != *(char *)((long)puVar40 + uVar66)) {
        puVar62 = (ulong *)((long)puVar67 + uVar66);
        break;
      }
      uVar66 = uVar66 + 1;
    } while (uVar37 != uVar66);
  }
  uVar37 = (long)puVar62 - (long)puVar53;
LAB_0110a7a2:
  if (((uVar37 != 0) && (uVar60 < pBVar13->cutoffTransformsCount + uVar37)) &&
     (pvVar32 = (void *)((long)pvVar41 +
                        ((ulong)((uint)(pBVar13->cutoffTransforms >>
                                       ((char)(uVar60 - uVar37) * '\x06' & 0x3fU)) & 0x3f) +
                         (uVar60 - uVar37) * 4 << (pBVar20->size_bits_by_length[uVar60] & 0x3f)) +
                        (ulong)pBVar13->hash_table_words[uVar57] + lVar31), pvVar32 <= pvVar14)) {
    iVar30 = 0x1f;
    if ((uint)pvVar32 != 0) {
      for (; (uint)pvVar32 >> iVar30 == 0; iVar30 = iVar30 + -1) {
      }
    }
    uVar60 = (uVar37 * 0x87 - (ulong)(uint)(iVar30 * 0x1e)) + 0x780;
    if (local_1a8 <= uVar60) {
      local_15c = (uint)bVar34 - (int)uVar37;
      local_198 = local_198 + 1;
      pHVar16->dict_num_matches = local_198;
      local_1a0 = (void *)uVar37;
      local_1a8 = uVar60;
      local_120 = pvVar32;
    }
  }
LAB_0110a824:
  uVar57 = uVar57 + 1;
  bVar25 = !bVar73;
  bVar73 = false;
  if (bVar25) goto LAB_0110a61b;
  goto LAB_0110a6d5;
code_r0x0110a986:
  lVar59 = lVar59 + 8;
  lVar54 = lVar39 + -8;
  if ((uVar68 + lVar39) - 8 < 8) goto code_r0x0110a9a1;
  goto LAB_0110a975;
code_r0x0110a9a1:
  if (uVar68 - lVar59 == 0) {
    puVar55 = puVar61 + lVar59;
  }
  else {
    puVar55 = puVar61 + (uVar68 - lVar59) + lVar59;
    uVar75 = 8 - lVar39;
    do {
      if (puVar61[uVar75] != *(uint8_t *)((long)puVar53 + uVar75)) {
        puVar55 = puVar61 + uVar75;
        break;
      }
      uVar75 = uVar75 + 1;
    } while (uVar68 != uVar75);
  }
  uVar75 = (long)puVar55 - (long)puVar61;
LAB_0110a9f7:
  if ((3 < uVar75) && (local_1a0 < uVar75)) {
    iVar30 = 0x1f;
    if (uVar51 != 0) {
      for (; uVar51 >> iVar30 == 0; iVar30 = iVar30 + -1) {
      }
    }
    uVar57 = (ulong)(iVar30 * -0x1e + 0x780) + uVar75 * 0x87;
    if (local_1a8 < uVar57) {
      local_15c = 0;
      local_1a0 = (void *)uVar75;
      local_1a8 = uVar57;
      local_120 = (void *)(ulong)uVar51;
    }
  }
LAB_0110a934:
  uVar29 = ~(uint)bVar34 * uVar7 + (uint)bVar50 + uVar29 * uVar27 + 1;
  pvVar32 = (void *)((long)pvVar32 + 1);
  if (pvVar45 < pvVar32) goto LAB_0110aa59;
  goto LAB_0110a8bb;
LAB_0110aa59:
  (hasher->privat)._H65.hb.state = uVar29;
LAB_0110aa67:
  (hasher->privat)._H35.ha_common.extra[3] = (void *)((long)pvVar45 + 1);
  local_100 = (ulong)local_1a0;
LAB_0110aa72:
  sVar17 = (params->dictionary).compound.num_chunks;
  sVar18 = (params->dictionary).compound.total_size;
  if (sVar17 != 0) {
    sVar65 = 0;
    uVar75 = local_100;
LAB_0110aaa0:
    pPVar19 = (params->dictionary).compound.chunks[sVar65];
    bVar34 = (byte)pPVar19->bucket_bits;
    bVar50 = (byte)pPVar19->slot_bits;
    bVar24 = -(char)pPVar19->hash_bits;
    uVar57 = ((*puVar53 << (bVar24 & 0x3f)) >> (bVar24 & 0x3f)) * 0x1fe35a7bd3579bd3 >>
             (-bVar34 & 0x3f);
    lVar54 = (1L << (bVar50 & 0x3f)) * 4;
    lVar59 = (1L << (bVar34 & 0x3f)) * 2;
    bVar50 = -bVar50;
    puVar44 = (undefined8 *)
              ((long)&pPVar19[1].magic + (ulong)pPVar19->num_items * 4 + lVar59 + lVar54);
    if (pPVar19->magic != 0xdebcede0) {
      puVar44 = (undefined8 *)*puVar44;
    }
    pvVar52 = (void *)((long)pvVar41 +
                      (sVar18 - (params->dictionary).compound.chunk_offsets[sVar65]));
    uVar60 = (ulong)pPVar19->source_size;
    uVar6 = *(ushort *)((long)&pPVar19[1].magic + (uVar57 & 0xffffffff) * 2 + lVar54);
    puVar49 = (uint *)((long)&pPVar19[1].magic +
                      (ulong)((uint)uVar6 +
                             (&pPVar19[1].magic)
                             [(uint)((int)uVar57 << (bVar50 & 0x1f)) >> (bVar50 & 0x1f)]) * 4 +
                      lVar59 + lVar54);
    lVar54 = 0;
    local_100 = uVar75;
LAB_0110ab54:
    pvVar32 = (void *)(long)dist_cache[lVar54];
    if (((void *)((long)pvVar52 - uVar60) < pvVar32) && (pvVar32 <= pvVar52)) {
      uVar57 = uVar60 - ((long)pvVar52 - (long)pvVar32);
      if (uVar68 <= uVar57) {
        uVar57 = uVar68;
      }
      lVar39 = ((long)pvVar52 - (long)pvVar32) + (long)puVar44;
      lVar59 = lVar39;
      puVar67 = puVar53;
      if (7 < uVar57) {
        lVar71 = 0;
LAB_0110ab87:
        if (*(ulong *)((long)puVar53 + lVar71) == *(ulong *)(lVar39 + lVar71))
        goto code_r0x0110ab94;
        uVar37 = *(ulong *)(lVar39 + lVar71) ^ *(ulong *)((long)puVar53 + lVar71);
        uVar57 = 0;
        if (uVar37 != 0) {
          for (; (uVar37 >> uVar57 & 1) == 0; uVar57 = uVar57 + 1) {
          }
        }
        uVar57 = (uVar57 >> 3 & 0x1fffffff) + lVar71;
        goto LAB_0110abf7;
      }
      goto LAB_0110abb1;
    }
    goto LAB_0110ac60;
  }
LAB_0110ade7:
  if (0x7e4 < local_1a8) {
    uVar74 = local_188 + 4;
    local_130 = (lVar3 + num_bytes) - (long)pvVar45;
    pvVar52 = (void *)(sVar9 + 1 + (long)pvVar45);
    local_dc = 0;
LAB_0110ae35:
    pvVar41 = pvVar5;
    if (pvVar52 < pvVar5) {
      pvVar41 = pvVar52;
    }
    uVar75 = uVar68 - 1;
    uVar57 = local_100 - 1;
    if (uVar75 <= local_100 - 1) {
      uVar57 = uVar75;
    }
    if (4 < params->quality) {
      uVar57 = 0;
    }
    pvVar46 = (void *)((long)pvVar45 + 1);
    pvVar32 = pvVar5;
    if (pvVar46 < pvVar5) {
      pvVar32 = pvVar46;
    }
    local_c8 = (void *)((long)pvVar45 + sVar9 + 1);
    if (pvVar5 <= local_c8) {
      local_c8 = pvVar5;
    }
    if ((params->dictionary).contextual.context_based != 0) {
      local_e0 = (uint)(params->dictionary).contextual.context_map
                       [literal_context_lut[local_88 + 0x100] |
                        literal_context_lut[ringbuffer[(ulong)pvVar45 & ringbuffer_mask]]];
      local_88 = (ulong)ringbuffer[(ulong)pvVar45 & ringbuffer_mask];
    }
    pBVar13 = (params->dictionary).contextual.dict[local_e0];
    uVar60 = (ulong)pvVar46 & ringbuffer_mask;
    uVar37 = (ulong)(hasher->privat)._H6.num_last_distances_to_check_;
    if (uVar37 != 0) {
      puVar61 = ringbuffer + uVar60;
      local_1b8 = 0x7e4;
      uVar66 = 0;
      local_198 = 0;
      local_1c0 = (void *)0x0;
LAB_0110af56:
      pvVar33 = (void *)(long)dist_cache[uVar66];
      if (((pvVar33 <= pvVar32) && ((void *)((long)pvVar46 - (long)pvVar33) < pvVar46)) &&
         (uVar60 + uVar57 <= ringbuffer_mask)) {
        uVar43 = (ulong)((long)pvVar46 - (long)pvVar33) & ringbuffer_mask;
        uVar70 = uVar43 + uVar57;
        if ((ringbuffer_mask < uVar70) || (ringbuffer[uVar60 + uVar57] != ringbuffer[uVar70]))
        goto LAB_0110b0a4;
        puVar38 = ringbuffer + uVar43;
        puVar55 = puVar38;
        uVar70 = uVar75;
        puVar69 = puVar61;
        if (7 < uVar75) {
          lVar54 = 0;
          lVar59 = 0;
LAB_0110afbe:
          if (*(ulong *)(puVar61 + lVar54) == *(ulong *)(puVar38 + lVar54)) goto code_r0x0110afcb;
          uVar43 = *(ulong *)(puVar38 + lVar54) ^ *(ulong *)(puVar61 + lVar54);
          uVar70 = 0;
          if (uVar43 != 0) {
            for (; (uVar43 >> uVar70 & 1) == 0; uVar70 = uVar70 + 1) {
            }
          }
          uVar70 = (uVar70 >> 3 & 0x1fffffff) - lVar59;
          goto LAB_0110b03b;
        }
        goto LAB_0110aff6;
      }
      goto LAB_0110b0a4;
    }
    local_1b8 = 0x7e4;
    local_1c0 = (void *)0x0;
    local_198 = 0;
LAB_0110b0d8:
    puVar53 = (ulong *)(ringbuffer + uVar60);
    uVar70 = *(long *)(ringbuffer + uVar60) * uVar15 >> 0x31;
    lVar54 = uVar70 << (*(byte *)((long)&hasher->privat + 0x1c) & 0x3f);
    uVar6 = *(ushort *)((long)puVar11 + uVar70 * 2);
    uVar66 = (ulong)uVar6;
    uVar37 = 0;
    if (uVar42 <= uVar66) {
      uVar37 = uVar66 - uVar42;
    }
    if (uVar37 < uVar66) {
      uVar43 = uVar68 - 5;
      piVar1 = (int *)((long)puVar53 + 4);
LAB_0110b15b:
      uVar66 = uVar66 - 1;
      pvVar33 = (void *)((long)pvVar46 -
                        (ulong)puVar12[lVar54 + (ulong)((uint)uVar66 &
                                                       (hasher->privat)._H6.block_mask_)]);
      if (pvVar33 <= pvVar32) {
        if (uVar60 + uVar57 <= ringbuffer_mask) {
          uVar72 = (ulong)(puVar12[lVar54 + (ulong)((uint)uVar66 & (hasher->privat)._H6.block_mask_)
                                  ] & uVar63);
          if (((ringbuffer_mask < uVar72 + uVar57) ||
              (ringbuffer[uVar60 + uVar57] != ringbuffer[uVar72 + uVar57])) ||
             (*(int *)(ringbuffer + uVar72) != (int)*(long *)(ringbuffer + uVar60)))
          goto LAB_0110b243;
          puVar55 = ringbuffer + uVar72 + 4;
          piVar64 = piVar1;
          puVar61 = puVar55;
          uVar72 = uVar43;
          if (7 < uVar43) {
            lVar59 = 0;
LAB_0110b1e8:
            if (*(ulong *)((long)piVar1 + lVar59) == *(ulong *)(puVar55 + lVar59))
            goto code_r0x0110b1f5;
            uVar47 = *(ulong *)(puVar55 + lVar59) ^ *(ulong *)((long)piVar1 + lVar59);
            uVar72 = 0;
            if (uVar47 != 0) {
              for (; (uVar47 >> uVar72 & 1) == 0; uVar72 = uVar72 + 1) {
              }
            }
            lVar59 = (uVar72 >> 3 & 0x1fffffff) + lVar59;
            goto LAB_0110b280;
          }
          goto LAB_0110b20f;
        }
        goto LAB_0110b243;
      }
    }
LAB_0110b2b4:
    puVar12[lVar54 + (ulong)((hasher->privat)._H6.block_mask_ & (uint)uVar6)] = (uint32_t)pvVar46;
    *(ushort *)((long)puVar11 + uVar70 * 2) = uVar6 + 1;
    iVar30 = 0;
    local_1a0 = local_1c0;
    if (local_1b8 == 0x7e4) {
      pHVar16 = (hasher->privat)._H6.common_;
      uVar57 = pHVar16->dict_num_lookups;
      local_118 = pHVar16->dict_num_matches;
      local_1b8 = 0x7e4;
      if (uVar57 >> 7 <= local_118) {
        uVar37 = (ulong)((uint)((int)*puVar53 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
        puVar61 = pBVar13->hash_table_lengths;
        iVar30 = 0;
        local_1b8 = 0x7e4;
        bVar73 = true;
LAB_0110b3b5:
        uVar57 = uVar57 + 1;
        pHVar16->dict_num_lookups = uVar57;
        bVar34 = puVar61[uVar37];
        uVar66 = (ulong)bVar34;
        if ((uVar66 != 0) && (uVar66 <= uVar75)) {
          pBVar20 = pBVar13->words;
          puVar40 = (ulong *)(pBVar20->data +
                             (ulong)pBVar20->offsets_by_length[uVar66] +
                             pBVar13->hash_table_words[uVar37] * uVar66);
          uVar70 = uVar66;
          puVar67 = puVar53;
          if (7 < bVar34) {
            lVar54 = 0;
LAB_0110b418:
            if (*puVar40 == *puVar67) goto code_r0x0110b424;
            uVar43 = *puVar67 ^ *puVar40;
            uVar70 = 0;
            if (uVar43 != 0) {
              for (; (uVar43 >> uVar70 & 1) == 0; uVar70 = uVar70 + 1) {
              }
            }
            uVar70 = (uVar70 >> 3 & 0x1fffffff) - lVar54;
            goto LAB_0110b486;
          }
          goto LAB_0110b44b;
        }
        goto LAB_0110b517;
      }
    }
LAB_0110b338:
    local_190 = local_198;
    if (0x1f < uVar75) {
      pvVar33 = (hasher->privat)._H35.ha_common.extra[3];
      if (pvVar33 <= pvVar46) {
        uVar29 = (hasher->privat)._H65.hb.state;
        uVar27 = (hasher->privat)._H65.hb.factor;
        uVar7 = (hasher->privat)._H65.hb.factor_remove;
LAB_0110b5c1:
        uVar51 = uVar29 & 0x3fffffff;
        bVar34 = ringbuffer[(ulong)pvVar33 & ringbuffer_mask];
        bVar50 = ringbuffer[(long)pvVar33 + 0x20U & ringbuffer_mask];
        if (uVar51 < 0x1000000) {
          pvVar21 = (hasher->privat)._H35.ha_common.extra[2];
          uVar28 = *(uint *)((long)pvVar21 + (ulong)uVar51 * 4);
          *(int *)((long)pvVar21 + (ulong)uVar51 * 4) = (int)pvVar33;
          if ((pvVar33 == pvVar46) && (uVar28 != 0xffffffff)) {
            uVar51 = (uint32_t)pvVar46 - uVar28;
            if ((void *)(ulong)uVar51 <= pvVar32) {
              puVar61 = ringbuffer + (uVar28 & uVar63);
              lVar59 = 0;
              lVar54 = 0;
LAB_0110b65a:
              lVar39 = lVar54;
              if (*(ulong *)((long)puVar53 + lVar39) == *(ulong *)(puVar61 + lVar39))
              goto code_r0x0110b667;
              uVar37 = *(ulong *)(puVar61 + lVar39) ^ *(ulong *)((long)puVar53 + lVar39);
              uVar57 = 0;
              if (uVar37 != 0) {
                for (; (uVar37 >> uVar57 & 1) == 0; uVar57 = uVar57 + 1) {
                }
              }
              uVar57 = (uVar57 >> 3 & 0x1fffffff) + lVar39;
              goto LAB_0110b6ec;
            }
          }
        }
        goto LAB_0110b622;
      }
      goto LAB_0110b774;
    }
    goto LAB_0110b77f;
  }
  local_188 = local_188 + 1;
  position = (long)pvVar45 + 1;
  if (pvVar46 < position) {
    if ((void *)((ulong)(uint)((int)lVar36 * 4) + (long)pvVar46) < position) {
      pvVar52 = (void *)((long)pvVar45 + 0x11U);
      if (pvVar4 <= (void *)((long)pvVar45 + 0x11U)) {
        pvVar52 = pvVar4;
      }
      if (position < pvVar52) {
        uVar29 = (hasher->privat)._H6.block_mask_;
        uVar8 = *(undefined4 *)((long)&(hasher->privat)._H35.hb.table + 4);
        do {
          uVar68 = *(long *)(ringbuffer + (position & ringbuffer_mask)) * uVar15 >> 0x31;
          uVar6 = *(ushort *)((long)puVar11 + uVar68 * 2);
          *(ushort *)((long)puVar11 + uVar68 * 2) = uVar6 + 1;
          puVar12[(uVar68 << ((byte)uVar8 & 0x3f)) + (ulong)(uVar29 & uVar6)] = (uint32_t)position;
          local_188 = local_188 + 4;
          position = position + 4;
        } while (position < pvVar52);
      }
    }
    else {
      pvVar52 = (void *)((long)pvVar45 + 9U);
      if (pvVar4 <= (void *)((long)pvVar45 + 9U)) {
        pvVar52 = pvVar4;
      }
      if (position < pvVar52) {
        uVar29 = (hasher->privat)._H6.block_mask_;
        uVar8 = *(undefined4 *)((long)&(hasher->privat)._H35.hb.table + 4);
        do {
          uVar68 = *(long *)(ringbuffer + (position & ringbuffer_mask)) * uVar15 >> 0x31;
          uVar6 = *(ushort *)((long)puVar11 + uVar68 * 2);
          *(ushort *)((long)puVar11 + uVar68 * 2) = uVar6 + 1;
          puVar12[(uVar68 << ((byte)uVar8 & 0x3f)) + (ulong)(uVar29 & uVar6)] = (uint32_t)position;
          local_188 = local_188 + 2;
          position = position + 2;
        } while (position < pvVar52);
      }
    }
  }
  goto LAB_0110c136;
code_r0x0110ab94:
  uVar57 = uVar57 - 8;
  lVar71 = lVar71 + 8;
  if (uVar57 < 8) goto code_r0x0110aba2;
  goto LAB_0110ab87;
code_r0x0110aba2:
  lVar59 = lVar39 + lVar71;
  puVar67 = (ulong *)(lVar71 + (long)puVar53);
LAB_0110abb1:
  if (uVar57 != 0) {
    uVar37 = 0;
    do {
      uVar66 = uVar37;
      if (*(char *)(lVar59 + uVar37) != *(char *)((long)puVar67 + uVar37)) break;
      uVar37 = uVar37 + 1;
      uVar66 = uVar57;
    } while (uVar57 != uVar37);
    lVar59 = uVar66 + lVar59;
  }
  uVar57 = lVar59 - lVar39;
LAB_0110abf7:
  if ((1 < uVar57) && (uVar37 = uVar57 * 0x87 + 0x78f, local_1a8 < uVar37)) {
    if (lVar54 != 0) {
      uVar37 = uVar37 - ((0x1ca10U >> ((byte)lVar54 & 2) & 4) + 0x27);
    }
    if (local_1a8 < uVar37) {
      if (uVar75 < uVar57) {
        uVar75 = uVar57;
      }
      local_15c = 0;
      local_1a8 = uVar37;
      local_120 = pvVar32;
      local_100 = uVar57;
    }
  }
LAB_0110ac60:
  lVar54 = lVar54 + 1;
  if (lVar54 == 4) goto code_r0x0110ac6d;
  goto LAB_0110ab54;
code_r0x0110ac6d:
  if (uVar6 != 0xffff) {
LAB_0110ad8f:
    uVar29 = *puVar49;
    uVar37 = (ulong)(uVar29 & 0x7fffffff);
    pvVar32 = (void *)((long)pvVar52 - uVar37);
    uVar57 = uVar60 - uVar37;
    if (uVar68 <= uVar60 - uVar37) {
      uVar57 = uVar68;
    }
    if ((((pvVar32 <= pvVar14) && (uVar74 + uVar75 <= ringbuffer_mask)) && (uVar75 < uVar57)) &&
       (ringbuffer[uVar74 + uVar75] == *(uint8_t *)((long)puVar44 + uVar75 + uVar37))) {
      puVar62 = (ulong *)(uVar37 + (long)puVar44);
      puVar67 = puVar62;
      puVar40 = puVar53;
      if (7 < uVar57) {
        lVar54 = 0;
LAB_0110acc3:
        if (*puVar40 == *puVar67) goto code_r0x0110acce;
        uVar37 = *puVar67 ^ *puVar40;
        uVar57 = 0;
        if (uVar37 != 0) {
          for (; (uVar37 >> uVar57 & 1) == 0; uVar57 = uVar57 + 1) {
          }
        }
        uVar57 = (uVar57 >> 3 & 0x1fffffff) - lVar54;
        goto LAB_0110ad43;
      }
      goto LAB_0110ad02;
    }
    goto LAB_0110adba;
  }
LAB_0110adc2:
  sVar65 = sVar65 + 1;
  uVar75 = local_100;
  if (sVar65 == sVar17) goto LAB_0110ade7;
  goto LAB_0110aaa0;
code_r0x0110acce:
  puVar40 = puVar40 + 1;
  puVar67 = puVar67 + 1;
  lVar59 = uVar57 + lVar54;
  lVar54 = lVar54 + -8;
  if (lVar59 - 8U < 8) goto code_r0x0110aced;
  goto LAB_0110acc3;
code_r0x0110aced:
  uVar57 = uVar57 + lVar54;
  if (uVar57 != 0) {
LAB_0110ad02:
    uVar37 = 0;
    do {
      uVar66 = uVar37;
      if (*(char *)((long)puVar67 + uVar37) != *(char *)((long)puVar40 + uVar37)) break;
      uVar37 = uVar37 + 1;
      uVar66 = uVar57;
    } while (uVar57 != uVar37);
    puVar67 = (ulong *)((long)puVar67 + uVar66);
  }
  uVar57 = (long)puVar67 - (long)puVar62;
LAB_0110ad43:
  if (3 < uVar57) {
    iVar30 = 0x1f;
    if ((uint)pvVar32 != 0) {
      for (; (uint)pvVar32 >> iVar30 == 0; iVar30 = iVar30 + -1) {
      }
    }
    uVar37 = (ulong)(iVar30 * -0x1e + 0x780) + uVar57 * 0x87;
    if (local_1a8 < uVar37) {
      local_15c = 0;
      uVar75 = uVar57;
      local_1a8 = uVar37;
      local_120 = pvVar32;
      local_100 = uVar57;
    }
  }
LAB_0110adba:
  puVar49 = puVar49 + 1;
  if ((int)uVar29 < 0) goto LAB_0110adc2;
  goto LAB_0110ad8f;
code_r0x0110afcb:
  lVar54 = lVar54 + 8;
  lVar39 = local_130 + lVar59;
  lVar59 = lVar59 + -8;
  if (lVar39 - 8U < 8) goto code_r0x0110afe5;
  goto LAB_0110afbe;
code_r0x0110afe5:
  puVar55 = puVar38 + -lVar59;
  puVar69 = puVar61 + -lVar59;
  uVar70 = lVar59 + local_130;
LAB_0110aff6:
  if (uVar70 != 0) {
    uVar43 = 0;
    do {
      uVar72 = uVar43;
      if (puVar55[uVar43] != puVar69[uVar43]) break;
      uVar43 = uVar43 + 1;
      uVar72 = uVar70;
    } while (uVar70 != uVar43);
    puVar55 = puVar55 + uVar72;
  }
  uVar70 = (long)puVar55 - (long)puVar38;
LAB_0110b03b:
  if (((2 < uVar70) || ((uVar66 < 2 && (uVar70 == 2)))) &&
     (uVar43 = uVar70 * 0x87 + 0x78f, local_1b8 < uVar43)) {
    if (uVar66 != 0) {
      uVar43 = uVar43 - ((0x1ca10U >> ((byte)uVar66 & 0xe) & 0xe) + 0x27);
    }
    if (local_1b8 < uVar43) {
      uVar57 = uVar70;
      local_1c0 = pvVar33;
      local_1b8 = uVar43;
      local_198 = uVar70;
    }
  }
LAB_0110b0a4:
  uVar66 = uVar66 + 1;
  if (uVar66 == uVar37) goto LAB_0110b0d8;
  goto LAB_0110af56;
code_r0x0110b1f5:
  uVar72 = uVar72 - 8;
  lVar59 = lVar59 + 8;
  if (uVar72 < 8) goto code_r0x0110b203;
  goto LAB_0110b1e8;
code_r0x0110b203:
  puVar61 = puVar55 + lVar59;
  piVar64 = (int *)(lVar59 + (long)piVar1);
LAB_0110b20f:
  if (uVar72 != 0) {
    uVar47 = 0;
    do {
      uVar26 = uVar47;
      if (puVar61[uVar47] != *(uint8_t *)((long)piVar64 + uVar47)) break;
      uVar47 = uVar47 + 1;
      uVar26 = uVar72;
    } while (uVar72 != uVar47);
    puVar61 = puVar61 + uVar26;
  }
  lVar59 = (long)puVar61 - (long)puVar55;
LAB_0110b280:
  uVar72 = lVar59 + 4;
  iVar30 = 0x1f;
  if ((uint)pvVar33 != 0) {
    for (; (uint)pvVar33 >> iVar30 == 0; iVar30 = iVar30 + -1) {
    }
  }
  uVar47 = (ulong)(iVar30 * -0x1e + 0x780) + uVar72 * 0x87;
  if (local_1b8 < uVar47) {
    uVar57 = uVar72;
    local_1c0 = pvVar33;
    local_1b8 = uVar47;
    local_198 = uVar72;
  }
LAB_0110b243:
  if (uVar66 <= uVar37) goto LAB_0110b2b4;
  goto LAB_0110b15b;
code_r0x0110b424:
  puVar40 = puVar40 + 1;
  puVar67 = puVar67 + 1;
  lVar59 = uVar66 + lVar54;
  lVar54 = lVar54 + -8;
  if (lVar59 - 8U < 8) goto code_r0x0110b43e;
  goto LAB_0110b418;
code_r0x0110b43e:
  uVar70 = lVar54 + uVar66;
  if (lVar54 + uVar66 != 0) {
LAB_0110b44b:
    uVar43 = 0;
    do {
      uVar72 = uVar43;
      if (*(char *)((long)puVar67 + uVar43) != *(char *)((long)puVar40 + uVar43)) break;
      uVar43 = uVar43 + 1;
      uVar72 = uVar70;
    } while (uVar70 != uVar43);
    puVar67 = (ulong *)((long)puVar67 + uVar72);
  }
  uVar70 = (long)puVar67 - (long)puVar53;
LAB_0110b486:
  if (((uVar70 != 0) && (uVar66 < pBVar13->cutoffTransformsCount + uVar70)) &&
     (pvVar33 = (void *)((long)local_c8 +
                        ((ulong)((uint)(pBVar13->cutoffTransforms >>
                                       ((char)(uVar66 - uVar70) * '\x06' & 0x3fU)) & 0x3f) +
                         (uVar66 - uVar70) * 4 << (pBVar20->size_bits_by_length[uVar66] & 0x3f)) +
                        (ulong)pBVar13->hash_table_words[uVar37] + lVar31), pvVar33 <= pvVar14)) {
    iVar58 = 0x1f;
    if ((uint)pvVar33 != 0) {
      for (; (uint)pvVar33 >> iVar58 == 0; iVar58 = iVar58 + -1) {
      }
    }
    uVar66 = (uVar70 * 0x87 - (ulong)(uint)(iVar58 * 0x1e)) + 0x780;
    if (local_1b8 <= uVar66) {
      iVar30 = (uint)bVar34 - (int)uVar70;
      local_118 = local_118 + 1;
      pHVar16->dict_num_matches = local_118;
      local_1b8 = uVar66;
      local_1c0 = pvVar33;
      local_198 = uVar70;
    }
  }
LAB_0110b517:
  uVar37 = uVar37 + 1;
  bVar25 = !bVar73;
  local_1a0 = local_1c0;
  bVar73 = false;
  if (bVar25) goto LAB_0110b338;
  goto LAB_0110b3b5;
code_r0x0110b667:
  lVar54 = lVar39 + 8;
  lVar71 = lVar59 + uVar68;
  lVar59 = lVar59 + -8;
  if (lVar71 - 9U < 8) goto code_r0x0110b67d;
  goto LAB_0110b65a;
code_r0x0110b67d:
  puVar55 = puVar61 + lVar54;
  puVar69 = puVar55;
  if (lVar39 + 9U != uVar68) {
    puVar38 = (uint8_t *)((long)puVar53 + lVar54);
    lVar54 = lVar59 + uVar68 + -1;
    do {
      puVar69 = puVar55;
      if (*puVar55 != *puVar38) break;
      puVar38 = puVar38 + 1;
      puVar55 = puVar55 + 1;
      lVar54 = lVar54 + -1;
      puVar69 = puVar61 + (uVar68 - 1);
    } while (lVar54 != 0);
  }
  uVar57 = (long)puVar69 - (long)puVar61;
LAB_0110b6ec:
  if ((3 < uVar57) && (local_198 < uVar57)) {
    iVar58 = 0x1f;
    if (uVar51 != 0) {
      for (; uVar51 >> iVar58 == 0; iVar58 = iVar58 + -1) {
      }
    }
    uVar37 = (ulong)(iVar58 * -0x1e + 0x780) + uVar57 * 0x87;
    if (local_1b8 < uVar37) {
      iVar30 = 0;
      local_198 = uVar57;
      local_1b8 = uVar37;
      local_1a0 = (void *)(ulong)uVar51;
    }
  }
LAB_0110b622:
  uVar29 = ~(uint)bVar34 * uVar7 + (uint)bVar50 + uVar29 * uVar27 + 1;
  pvVar33 = (void *)((long)pvVar33 + 1);
  if (pvVar46 < pvVar33) goto LAB_0110b752;
  goto LAB_0110b5c1;
LAB_0110b752:
  (hasher->privat)._H65.hb.state = uVar29;
LAB_0110b774:
  (hasher->privat)._H35.ha_common.extra[3] = (void *)((long)pvVar45 + 2);
  local_190 = local_198;
LAB_0110b77f:
  if (sVar17 != 0) {
    sVar65 = 0;
LAB_0110b7bd:
    pPVar19 = (params->dictionary).compound.chunks[sVar65];
    bVar34 = (byte)pPVar19->bucket_bits;
    bVar50 = (byte)pPVar19->slot_bits;
    bVar24 = -(char)pPVar19->hash_bits;
    uVar68 = ((*puVar53 << (bVar24 & 0x3f)) >> (bVar24 & 0x3f)) * 0x1fe35a7bd3579bd3 >>
             (-bVar34 & 0x3f);
    lVar54 = (1L << (bVar50 & 0x3f)) * 4;
    lVar59 = (1L << (bVar34 & 0x3f)) * 2;
    bVar50 = -bVar50;
    puVar44 = (undefined8 *)
              ((long)&pPVar19[1].magic + (ulong)pPVar19->num_items * 4 + lVar59 + lVar54);
    if (pPVar19->magic != 0xdebcede0) {
      puVar44 = (undefined8 *)*puVar44;
    }
    sVar22 = (params->dictionary).compound.chunk_offsets[sVar65];
    pvVar32 = (void *)((long)local_c8 + (sVar18 - sVar22));
    uVar57 = (ulong)pPVar19->source_size;
    uVar6 = *(ushort *)((long)&pPVar19[1].magic + (uVar68 & 0xffffffff) * 2 + lVar54);
    puVar49 = (uint *)((long)&pPVar19[1].magic +
                      (ulong)((uint)uVar6 +
                             (&pPVar19[1].magic)
                             [(uint)((int)uVar68 << (bVar50 & 0x1f)) >> (bVar50 & 0x1f)]) * 4 +
                      lVar59 + lVar54);
    lVar54 = 0;
    uVar68 = local_190;
LAB_0110b88b:
    pvVar33 = (void *)(long)dist_cache[lVar54];
    if (((void *)((long)pvVar32 - uVar57) < pvVar33) && (pvVar33 <= pvVar32)) {
      uVar37 = uVar57 - ((long)pvVar32 - (long)pvVar33);
      if (uVar75 <= uVar37) {
        uVar37 = uVar75;
      }
      lVar39 = ((long)pvVar32 - (long)pvVar33) + (long)puVar44;
      lVar59 = lVar39;
      puVar67 = puVar53;
      if (7 < uVar37) {
        lVar59 = (sVar18 - sVar22) - (long)pvVar33;
        lVar71 = 0;
LAB_0110b8c9:
        uVar66 = *(ulong *)((long)puVar44 + (long)pvVar41 + lVar71 + lVar59);
        if (*(ulong *)((long)puVar53 + lVar71) == uVar66) goto code_r0x0110b8d6;
        uVar66 = uVar66 ^ *(ulong *)((long)puVar53 + lVar71);
        uVar37 = 0;
        if (uVar66 != 0) {
          for (; (uVar66 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
          }
        }
        uVar37 = (uVar37 >> 3 & 0x1fffffff) + lVar71;
        goto LAB_0110b95d;
      }
      goto LAB_0110b8ff;
    }
    goto LAB_0110b9c2;
  }
LAB_0110bb69:
  uVar68 = local_1a8 + 0xaf;
  local_1a8 = local_1b8;
  if (local_1b8 < uVar68) {
    pvVar46 = pvVar45;
    local_190 = local_100;
    iVar30 = local_15c;
    sVar65 = local_188;
    local_c8 = (void *)((long)pvVar45 + sVar9);
    if (pvVar5 <= (void *)((long)pvVar45 + sVar9)) {
      local_c8 = pvVar5;
    }
    goto LAB_0110bd0e;
  }
  local_120 = local_1a0;
  sVar65 = uVar74;
  if (local_dc == 3) goto LAB_0110bd0e;
  local_188 = local_188 + 1;
  local_dc = local_dc + 1;
  uVar57 = (long)pvVar45 + 9;
  local_130 = local_130 - 1;
  pvVar52 = (void *)((long)pvVar52 + 1);
  local_100 = local_190;
  pvVar45 = pvVar46;
  uVar68 = uVar75;
  sVar65 = local_188;
  local_15c = iVar30;
  if (uVar2 <= uVar57) goto LAB_0110bd0e;
  goto LAB_0110ae35;
code_r0x0110b8d6:
  uVar37 = uVar37 - 8;
  lVar71 = lVar71 + 8;
  if (uVar37 < 8) goto code_r0x0110b8e4;
  goto LAB_0110b8c9;
code_r0x0110b8e4:
  lVar59 = (long)puVar44 + (long)pvVar41 + lVar71 + lVar59;
  puVar67 = (ulong *)(lVar71 + (long)puVar53);
LAB_0110b8ff:
  if (uVar37 != 0) {
    uVar66 = 0;
    do {
      uVar70 = uVar66;
      if (*(char *)(lVar59 + uVar66) != *(char *)((long)puVar67 + uVar66)) break;
      uVar66 = uVar66 + 1;
      uVar70 = uVar37;
    } while (uVar37 != uVar66);
    lVar59 = lVar59 + uVar70;
  }
  uVar37 = lVar59 - lVar39;
LAB_0110b95d:
  if ((1 < uVar37) && (uVar66 = uVar37 * 0x87 + 0x78f, local_1b8 < uVar66)) {
    if (lVar54 != 0) {
      uVar66 = uVar66 - ((0x1ca10U >> ((byte)lVar54 & 2) & 4) + 0x27);
    }
    if (local_1b8 < uVar66) {
      if (uVar68 < uVar37) {
        uVar68 = uVar37;
      }
      iVar30 = 0;
      local_1b8 = uVar66;
      local_1a0 = pvVar33;
      local_190 = uVar37;
    }
  }
LAB_0110b9c2:
  lVar54 = lVar54 + 1;
  if (lVar54 == 4) goto code_r0x0110b9cf;
  goto LAB_0110b88b;
code_r0x0110b9cf:
  if (uVar6 != 0xffff) {
LAB_0110b9da:
    uVar29 = *puVar49;
    uVar70 = (ulong)(uVar29 & 0x7fffffff);
    pvVar33 = (void *)((long)pvVar32 - uVar70);
    uVar37 = uVar57 - uVar70;
    uVar66 = uVar75;
    if (uVar37 < uVar75) {
      uVar66 = uVar37;
    }
    if ((((pvVar33 <= pvVar14) && (uVar60 + uVar68 <= ringbuffer_mask)) && (uVar68 < uVar66)) &&
       (ringbuffer[uVar60 + uVar68] == *(uint8_t *)((long)puVar44 + uVar68 + uVar70))) {
      puVar62 = (ulong *)(uVar70 + (long)puVar44);
      puVar67 = puVar62;
      puVar40 = puVar53;
      if (7 < uVar66) {
        uVar66 = uVar37;
        if (local_130 < uVar37) {
          uVar66 = local_130;
        }
        lVar54 = 0;
        puVar56 = puVar62;
LAB_0110ba6a:
        if (*puVar40 == *puVar56) goto code_r0x0110ba75;
        uVar66 = *puVar56 ^ *puVar40;
        uVar37 = 0;
        if (uVar66 != 0) {
          for (; (uVar66 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
          }
        }
        uVar37 = (uVar37 >> 3 & 0x1fffffff) - lVar54;
        goto LAB_0110bae7;
      }
      goto LAB_0110baa6;
    }
    goto LAB_0110ba08;
  }
LAB_0110bb44:
  sVar65 = sVar65 + 1;
  if (sVar65 == sVar17) goto LAB_0110bb69;
  goto LAB_0110b7bd;
code_r0x0110ba75:
  puVar40 = puVar40 + 1;
  puVar56 = puVar56 + 1;
  lVar59 = uVar66 + lVar54;
  lVar54 = lVar54 + -8;
  if (lVar59 - 8U < 8) goto code_r0x0110ba8f;
  goto LAB_0110ba6a;
code_r0x0110ba8f:
  if (local_130 < uVar37) {
    uVar37 = local_130;
  }
  uVar66 = uVar37 + lVar54;
  puVar67 = puVar56;
  if (uVar66 != 0) {
LAB_0110baa6:
    puVar56 = (ulong *)((long)puVar67 + uVar66);
    uVar37 = 0;
    do {
      if (*(char *)((long)puVar67 + uVar37) != *(char *)((long)puVar40 + uVar37)) {
        puVar56 = (ulong *)((long)puVar67 + uVar37);
        break;
      }
      uVar37 = uVar37 + 1;
    } while (uVar66 != uVar37);
  }
  uVar37 = (long)puVar56 - (long)puVar62;
LAB_0110bae7:
  if (3 < uVar37) {
    iVar58 = 0x1f;
    if ((uint)pvVar33 != 0) {
      for (; (uint)pvVar33 >> iVar58 == 0; iVar58 = iVar58 + -1) {
      }
    }
    uVar66 = (ulong)(iVar58 * -0x1e + 0x780) + uVar37 * 0x87;
    if (local_1b8 < uVar66) {
      iVar30 = 0;
      uVar68 = uVar37;
      local_1b8 = uVar66;
      local_1a0 = pvVar33;
      local_190 = uVar37;
    }
  }
LAB_0110ba08:
  puVar49 = puVar49 + 1;
  if ((int)uVar29 < 0) goto LAB_0110bb44;
  goto LAB_0110b9da;
LAB_0110bd0e:
  local_188 = sVar65;
  local_c8 = (void *)((long)local_c8 + sVar10);
  if (local_c8 < local_120) {
LAB_0110bd2b:
    uVar68 = (long)local_120 + 0xf;
LAB_0110bd2f:
    if ((local_120 <= local_c8) && (uVar68 != 0)) {
      dist_cache[3] = dist_cache[2];
      uVar23 = *(undefined8 *)dist_cache;
      *(undefined8 *)(dist_cache + 1) = uVar23;
      iVar58 = (int)local_120;
      *dist_cache = iVar58;
      uVar29 = (uint)(hasher->privat)._H35.hb.next_ix;
      if (4 < (int)uVar29) {
        dist_cache[4] = iVar58 + -1;
        dist_cache[5] = iVar58 + 1;
        dist_cache[6] = iVar58 + -2;
        dist_cache[7] = iVar58 + 2;
        dist_cache[8] = iVar58 + -3;
        dist_cache[9] = iVar58 + 3;
        if (10 < uVar29) {
          iVar58 = (int)uVar23;
          dist_cache[10] = iVar58 + -1;
          dist_cache[0xb] = iVar58 + 1;
          dist_cache[0xc] = iVar58 + -2;
          dist_cache[0xd] = iVar58 + 2;
          *(ulong *)(dist_cache + 0xe) = CONCAT44(iVar58 + 3,iVar58 + -3);
        }
      }
    }
  }
  else {
    if (local_120 != (void *)(long)*dist_cache) {
      uVar68 = 1;
      if (local_120 != (void *)(long)dist_cache[1]) {
        uVar68 = (long)local_120 + (3 - (long)*dist_cache);
        if (uVar68 < 7) {
          bVar34 = (byte)((int)uVar68 << 2);
          uVar29 = 0x9750468;
        }
        else {
          uVar68 = (long)local_120 + (3 - (long)dist_cache[1]);
          if (6 < uVar68) {
            uVar68 = 2;
            if ((local_120 != (void *)(long)dist_cache[2]) &&
               (uVar68 = 3, local_120 != (void *)(long)dist_cache[3])) goto LAB_0110bd2b;
            goto LAB_0110bd2f;
          }
          bVar34 = (byte)((int)uVar68 << 2);
          uVar29 = 0xfdb1ace;
        }
        uVar68 = (ulong)(uVar29 >> (bVar34 & 0x1f) & 0xf);
      }
      goto LAB_0110bd2f;
    }
    uVar68 = 0;
  }
  uVar29 = (uint)local_188;
  local_110->insert_len_ = uVar29;
  local_110->copy_len_ = iVar30 << 0x19 | (uint)local_190;
  uVar74 = (ulong)(params->dist).num_direct_distance_codes;
  uVar42 = uVar74 + 0x10;
  uVar27 = 0;
  if (uVar42 <= uVar68) {
    uVar63 = (params->dist).distance_postfix_bits;
    bVar34 = (byte)uVar63;
    uVar74 = ((4L << (bVar34 & 0x3f)) + (uVar68 - uVar74)) - 0x10;
    uVar51 = 0x1f;
    uVar28 = (uint)uVar74;
    if (uVar28 != 0) {
      for (; uVar28 >> uVar51 == 0; uVar51 = uVar51 - 1) {
      }
    }
    uVar51 = (uVar51 ^ 0xffffffe0) + 0x1f;
    uVar75 = (ulong)((uVar74 >> ((ulong)uVar51 & 0x3f) & 1) != 0);
    lVar54 = (ulong)uVar51 - (ulong)uVar63;
    uVar68 = (~(-1 << (bVar34 & 0x1f)) & uVar28) + uVar42 +
             (uVar75 + lVar54 * 2 + 0xfffe << (bVar34 & 0x3f)) | lVar54 * 0x400;
    uVar27 = (uint32_t)(uVar74 - (uVar75 + 2 << ((byte)uVar51 & 0x3f)) >> (bVar34 & 0x3f));
  }
  local_110->dist_prefix_ = (uint16_t)uVar68;
  local_110->dist_extra_ = uVar27;
  if (5 < local_188) {
    if (local_188 < 0x82) {
      uVar29 = 0x1f;
      uVar63 = (uint)(local_188 - 2);
      if (uVar63 != 0) {
        for (; uVar63 >> uVar29 == 0; uVar29 = uVar29 - 1) {
        }
      }
      uVar29 = (int)(local_188 - 2 >> ((char)(uVar29 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
               (uVar29 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (local_188 < 0x842) {
      uVar63 = 0x1f;
      if (uVar29 - 0x42 != 0) {
        for (; uVar29 - 0x42 >> uVar63 == 0; uVar63 = uVar63 - 1) {
        }
      }
      uVar29 = (uVar63 ^ 0xffe0) + 0x2a;
    }
    else {
      uVar29 = 0x15;
      if (0x1841 < local_188) {
        uVar29 = (uint)(ushort)(0x17 - (local_188 < 0x5842));
      }
    }
  }
  uVar63 = iVar30 + (uint)local_190;
  if (uVar63 < 10) {
    uVar51 = uVar63 - 2;
  }
  else if (uVar63 < 0x86) {
    uVar63 = uVar63 - 6;
    uVar51 = 0x1f;
    if (uVar63 != 0) {
      for (; uVar63 >> uVar51 == 0; uVar51 = uVar51 - 1) {
      }
    }
    uVar51 = (uVar63 >> ((char)(uVar51 ^ 0xffffffe0) + 0x1fU & 0x1f)) + (uVar51 ^ 0xffffffe0) * 2 +
             0x42;
  }
  else {
    uVar51 = 0x17;
    if (uVar63 < 0x846) {
      uVar51 = 0x1f;
      if (uVar63 - 0x46 != 0) {
        for (; uVar63 - 0x46 >> uVar51 == 0; uVar51 = uVar51 - 1) {
        }
      }
      uVar51 = (uVar51 ^ 0xffe0) + 0x2c;
    }
  }
  uVar6 = (ushort)uVar51;
  uVar48 = (uVar6 & 7) + ((ushort)uVar29 & 7) * 8;
  if ((((uVar68 & 0x3ff) == 0) && ((ushort)uVar29 < 8)) && (uVar6 < 0x10)) {
    if (7 < uVar6) {
      uVar48 = uVar48 + 0x40;
    }
  }
  else {
    iVar30 = ((uVar29 & 0xffff) >> 3) * 3 + ((uVar51 & 0xffff) >> 3);
    uVar48 = uVar48 + ((ushort)(0x520d40 >> ((char)iVar30 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar30 * 0x40 + 0x40;
  }
  local_110->cmd_prefix_ = uVar48;
  *num_literals = *num_literals + local_188;
  position = local_190 + (long)pvVar46;
  pvVar45 = pvVar35;
  if (position < pvVar35) {
    pvVar45 = (void *)position;
  }
  pvVar52 = (void *)((long)pvVar46 + 2);
  if (local_120 < (void *)(local_190 >> 2)) {
    pvVar41 = (void *)(position + (long)local_120 * -4);
    if (pvVar41 < pvVar52) {
      pvVar41 = pvVar52;
    }
    pvVar52 = pvVar41;
    if (pvVar45 < pvVar41) {
      pvVar52 = pvVar45;
    }
  }
  pvVar46 = (void *)((long)pvVar46 + local_190 * 2 + lVar36);
  local_110 = local_110 + 1;
  if (pvVar52 < pvVar45) {
    uVar15 = (hasher->privat)._H6.hash_mul_;
    uVar29 = (hasher->privat)._H6.block_mask_;
    uVar8 = *(undefined4 *)((long)&(hasher->privat)._H35.hb.table + 4);
    do {
      uVar68 = *(long *)(ringbuffer + ((ulong)pvVar52 & ringbuffer_mask)) * uVar15 >> 0x31;
      uVar6 = *(ushort *)((long)puVar11 + uVar68 * 2);
      *(ushort *)((long)puVar11 + uVar68 * 2) = uVar6 + 1;
      puVar12[(uVar68 << ((byte)uVar8 & 0x3f)) + (ulong)(uVar29 & uVar6)] = (uint32_t)pvVar52;
      pvVar52 = (void *)((long)pvVar52 + 1);
    } while (pvVar45 != pvVar52);
    local_188 = 0;
  }
  else {
    local_188 = 0;
  }
LAB_0110c136:
  pvVar45 = (void *)position;
  if (uVar2 <= position + 8) goto LAB_0110c1a0;
  goto LAB_0110a16e;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = params->dictionary.compound.total_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    int dict_id = 0;
    uint8_t p1 = 0;
    uint8_t p2 = 0;
    if (params->dictionary.contextual.context_based) {
      p1 = position >= 1 ?
          ringbuffer[(size_t)(position - 1) & ringbuffer_mask] : 0;
      p2 = position >= 2 ?
          ringbuffer[(size_t)(position - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(privat, params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance, &sr);
    if (ENABLE_COMPOUND_DICTIONARY) {
      LookupCompoundDictionaryMatch(&params->dictionary.compound, ringbuffer,
          ringbuffer_mask, dist_cache, position, max_length,
          dictionary_start, params->dist.max_distance, &sr);
    }
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        dictionary_start = BROTLI_MIN(size_t,
            position + 1 + position_offset, max_backward_limit);
        if (params->dictionary.contextual.context_based) {
          p2 = p1;
          p1 = ringbuffer[position & ringbuffer_mask];
          dict_id = params->dictionary.contextual.context_map[
              BROTLI_CONTEXT(p1, p2, literal_context_lut)];
        }
        FN(FindLongestMatch)(privat,
            params->dictionary.contextual.dict[dict_id],
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, dictionary_start + gap, params->dist.max_distance,
            &sr2);
        if (ENABLE_COMPOUND_DICTIONARY) {
          LookupCompoundDictionaryMatch(
              &params->dictionary.compound, ringbuffer,
              ringbuffer_mask, dist_cache, position + 1, max_length,
              dictionary_start, params->dist.max_distance, &sr2);
        }
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}